

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * NMEADeviceThread(void *pParam)

{
  int iVar1;
  undefined1 local_408 [8];
  NMEADATA nmeadata;
  int err;
  int res;
  int id;
  NMEADEVICE *pNMEADevice;
  void *pParam_local;
  
  err = 0;
  nmeadata.AIS_COG._4_4_ = 0;
  do {
    if (addrsNMEADevice[err] == pParam) {
      memset(local_408,0,0x3d8);
      do {
        mSleep((long)*(int *)((long)pParam + 0x900));
        memset(local_408,0,0x3d8);
        iVar1 = GetLatestDataNMEADevice((NMEADEVICE *)pParam,(NMEADATA *)local_408);
        if (iVar1 != 0) {
          nmeadata.AIS_COG._4_4_ = iVar1;
        }
        EnterCriticalSection(NMEADeviceCS + err);
        memcpy(nmeadataNMEADevice + err,local_408,0x3d8);
        resNMEADevice[err] = nmeadata.AIS_COG._4_4_;
        LeaveCriticalSection(NMEADeviceCS + err);
      } while (bExitNMEADevice[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE* pNMEADevice = (NMEADEVICE*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	NMEADATA nmeadata;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&nmeadata, 0, sizeof(NMEADATA));
	for (;;)
	{
		mSleep(pNMEADevice->threadperiod);
		memset(&nmeadata, 0, sizeof(NMEADATA));
		res = GetLatestDataNMEADevice(pNMEADevice, &nmeadata);
		if (res != EXIT_SUCCESS) err = res;
		EnterCriticalSection(&NMEADeviceCS[id]);
		nmeadataNMEADevice[id] = nmeadata;
		resNMEADevice[id] = err;
		LeaveCriticalSection(&NMEADeviceCS[id]);
		if (bExitNMEADevice[id]) break;
	}

	return 0;
}